

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_genn.cc
# Opt level: O1

int GENERAL_NAME_cmp(GENERAL_NAME *a,GENERAL_NAME *b)

{
  EDIPARTYNAME *pEVar1;
  EDIPARTYNAME *pEVar2;
  OTHERNAME *pOVar3;
  OTHERNAME *pOVar4;
  int iVar5;
  ASN1_STRING *pAVar6;
  ASN1_STRING *pAVar7;
  
  if (b == (GENERAL_NAME *)0x0 || a == (GENERAL_NAME *)0x0) {
    return -1;
  }
  if (a->type != b->type) {
    return -1;
  }
  switch(a->type) {
  case 0:
    pOVar3 = (a->d).otherName;
    pOVar4 = (b->d).otherName;
    if (pOVar4 == (OTHERNAME *)0x0 || pOVar3 == (OTHERNAME *)0x0) {
      return -1;
    }
    iVar5 = OBJ_cmp(pOVar3->type_id,pOVar4->type_id);
    if (iVar5 != 0) {
      return iVar5;
    }
    iVar5 = ASN1_TYPE_cmp(pOVar3->value,pOVar4->value);
    return iVar5;
  case 1:
  case 2:
  case 3:
  case 6:
    pAVar7 = (ASN1_STRING *)(a->d).otherName;
    pAVar6 = (ASN1_STRING *)(b->d).otherName;
    break;
  case 4:
    iVar5 = X509_NAME_cmp((a->d).directoryName,(b->d).directoryName);
    return iVar5;
  case 5:
    pEVar1 = (a->d).ediPartyName;
    pEVar2 = (b->d).ediPartyName;
    pAVar7 = pEVar1->nameAssigner;
    pAVar6 = pEVar2->nameAssigner;
    if (pAVar7 == (ASN1_STRING *)0x0) {
      if (pAVar6 != (ASN1_STRING *)0x0) {
        return -1;
      }
    }
    else {
      if (pAVar6 == (ASN1_STRING *)0x0) {
        return -1;
      }
      iVar5 = ASN1_STRING_cmp(pAVar7,pAVar6);
      if (iVar5 != 0) {
        return -1;
      }
    }
    pAVar7 = pEVar1->partyName;
    pAVar6 = pEVar2->partyName;
    break;
  case 7:
    iVar5 = ASN1_OCTET_STRING_cmp((a->d).iPAddress,(b->d).iPAddress);
    return iVar5;
  case 8:
    iVar5 = OBJ_cmp((a->d).registeredID,(b->d).registeredID);
    return iVar5;
  default:
    return -1;
  }
  iVar5 = ASN1_STRING_cmp(pAVar7,pAVar6);
  return iVar5;
}

Assistant:

int GENERAL_NAME_cmp(const GENERAL_NAME *a, const GENERAL_NAME *b) {
  if (!a || !b || a->type != b->type) {
    return -1;
  }

  switch (a->type) {
    case GEN_X400:
      return ASN1_STRING_cmp(a->d.x400Address, b->d.x400Address);

    case GEN_EDIPARTY:
      return edipartyname_cmp(a->d.ediPartyName, b->d.ediPartyName);

    case GEN_OTHERNAME:
      return othername_cmp(a->d.otherName, b->d.otherName);

    case GEN_EMAIL:
    case GEN_DNS:
    case GEN_URI:
      return ASN1_STRING_cmp(a->d.ia5, b->d.ia5);

    case GEN_DIRNAME:
      return X509_NAME_cmp(a->d.dirn, b->d.dirn);

    case GEN_IPADD:
      return ASN1_OCTET_STRING_cmp(a->d.ip, b->d.ip);

    case GEN_RID:
      return OBJ_cmp(a->d.rid, b->d.rid);
  }

  return -1;
}